

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O0

reference __thiscall
cmsys::
hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::find_or_insert(hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
                 *this,value_type *__obj)

{
  value_type p_Var1;
  bool bVar2;
  size_type __n_00;
  reference pp_Var3;
  char **__x;
  char **__y;
  _Node *__tmp;
  _Node *__cur;
  _Node *__first;
  size_type __n;
  value_type *__obj_local;
  hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
  *this_local;
  
  resize(this,this->_M_num_elements + 1);
  __n_00 = _M_bkt_num(this,__obj);
  pp_Var3 = std::
            vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
            ::operator[](&this->_M_buckets,__n_00);
  p_Var1 = *pp_Var3;
  for (__tmp = p_Var1; __tmp != (_Node *)0x0; __tmp = __tmp->_M_next) {
    __x = hash_select1st<const_char_*const,_int>::operator()
                    ((hash_select1st<const_char_*const,_int> *)&this->field_0x3,&__tmp->_M_val);
    __y = hash_select1st<const_char_*const,_int>::operator()
                    ((hash_select1st<const_char_*const,_int> *)&this->field_0x3,__obj);
    bVar2 = std::equal_to<const_char_*>::operator()
                      ((equal_to<const_char_*> *)&this->field_0x2,__x,__y);
    if (bVar2) goto LAB_0013adf0;
  }
  __tmp = _M_new_node(this,__obj);
  __tmp->_M_next = p_Var1;
  pp_Var3 = std::
            vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
            ::operator[](&this->_M_buckets,__n_00);
  *pp_Var3 = __tmp;
  this->_M_num_elements = this->_M_num_elements + 1;
LAB_0013adf0:
  this_local = (hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
                *)&__tmp->_M_val;
  return (reference)this_local;
}

Assistant:

typename hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::reference
hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::find_or_insert(const value_type& __obj)
{
  resize(_M_num_elements + 1);

  size_type __n = _M_bkt_num(__obj);
  _Node* __first = _M_buckets[__n];

  for (_Node* __cur = __first; __cur; __cur = __cur->_M_next)
    if (_M_equals(_M_get_key(__cur->_M_val), _M_get_key(__obj)))
      return __cur->_M_val;

  _Node* __tmp = _M_new_node(__obj);
  __tmp->_M_next = __first;
  _M_buckets[__n] = __tmp;
  ++_M_num_elements;
  return __tmp->_M_val;
}